

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

Entry * __thiscall
Lib::
DHMap<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
::findEntry(DHMap<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
            *this,pair<Kernel::TermSpec,_Kernel::TermSpec> *key)

{
  bool bVar1;
  uint *in_RDI;
  uint h2;
  Entry *res;
  uint pos;
  uint h1;
  pair<Kernel::TermSpec,_Kernel::TermSpec> *in_stack_ffffffffffffffa8;
  pair<Kernel::TermSpec,_Kernel::TermSpec> *in_stack_ffffffffffffffb0;
  bool local_41;
  Entry *local_40;
  uint local_2c;
  uint local_20;
  Entry *local_8;
  
  if (in_RDI[4] == 0) {
    local_8 = (Entry *)0x0;
  }
  else {
    local_20 = DefaultHash::hash<Kernel::TermSpec,Kernel::TermSpec>(in_stack_ffffffffffffffb0);
    local_20 = local_20 % in_RDI[4];
    local_40 = (Entry *)(*(long *)(in_RDI + 6) + (ulong)local_20 * 0x30);
    if ((uint)(local_40->field_0)._infoData >> 2 == *in_RDI) {
      bVar1 = std::operator==(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (bVar1) {
        if (((local_40->field_0)._infoData & 1U) != 0) {
          local_40 = (Entry *)0x0;
        }
        local_8 = local_40;
      }
      else if (((uint)(local_40->field_0)._infoData >> 1 & 1) == 0) {
        local_8 = (Entry *)0x0;
      }
      else {
        local_2c = DefaultHash2::hash<Kernel::TermSpec,Kernel::TermSpec>(in_stack_ffffffffffffffb0);
        local_2c = local_2c % in_RDI[4];
        if (local_2c == 0) {
          local_2c = 1;
        }
        do {
          local_20 = (local_20 + local_2c) % in_RDI[4];
          local_8 = (Entry *)(*(long *)(in_RDI + 6) + (ulong)local_20 * 0x30);
          local_41 = false;
          if ((uint)(local_8->field_0)._infoData >> 2 == *in_RDI) {
            local_41 = std::operator!=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
          }
        } while (local_41 != false);
        if ((uint)(local_8->field_0)._infoData >> 2 == *in_RDI) {
          if (((local_8->field_0)._infoData & 1U) != 0) {
            local_8 = (Entry *)0x0;
          }
        }
        else {
          local_8 = (Entry *)0x0;
        }
      }
    }
    else {
      local_8 = (Entry *)0x0;
    }
  }
  return local_8;
}

Assistant:

const Entry* findEntry(Key const& key) const
  {
    if (_capacity == 0) return nullptr;
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    unsigned pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }
    if(res->_key==key) {
      return res->_info.deleted ? 0 : res;
    }

    //We have a collision...

    if(!res->_info.collision) {
      //There were no collisions on this position during inserting,
      //so the key we're searching for isn't here anyway
      return 0;
    }

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);

    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }

    ASS(res->_key==key);
    return res->_info.deleted ? 0 : res;
  }